

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot_sync_ctx.cxx
# Opt level: O0

void __thiscall nuraft::snapshot_io_mgr::~snapshot_io_mgr(snapshot_io_mgr *this)

{
  int in_EDX;
  int in_ESI;
  snapshot_io_mgr *in_RDI;
  
  shutdown(in_RDI,in_ESI,in_EDX);
  std::__cxx11::
  list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
  ::~list((list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
           *)0x25c298);
  std::shared_ptr<nuraft::EventAwaiter>::~shared_ptr((shared_ptr<nuraft::EventAwaiter> *)0x25c2a6);
  std::thread::~thread((thread *)0x25c2b0);
  return;
}

Assistant:

snapshot_io_mgr::~snapshot_io_mgr() {
    shutdown();
}